

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O3

void * __thiscall CSnapshotBuilder::NewItem(CSnapshotBuilder *this,int Type,int ID,int Size)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  lVar4 = (long)this->m_DataSize;
  lVar2 = (long)this->m_NumItems;
  if ((lVar2 < 0x3ff) && (Size + lVar4 + lVar2 * 8 + 0x14U < 0x10000)) {
    mem_zero(this->m_aData + lVar4,Size + 4);
    pcVar3 = this->m_aData + lVar4 + 4;
    *(uint *)(this->m_aData + lVar4) = ID & 0xffffU | Type << 0x10;
    iVar1 = this->m_DataSize;
    this->m_aOffsets[this->m_NumItems] = iVar1;
    this->m_DataSize = iVar1 + Size + 4;
    this->m_NumItems = this->m_NumItems + 1;
  }
  else {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/snapshot.cpp"
                   ,0x29c,(uint)(lVar4 + lVar2 * 8 + 8U < 0x10000),"too much data");
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/snapshot.cpp"
                   ,0x29d,(uint)(this->m_NumItems < 0x400),"too many items");
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

void *CSnapshotBuilder::NewItem(int Type, int ID, int Size)
{
	if(m_DataSize + sizeof(CSnapshot) + sizeof(CSnapshotItem) + Size + (m_NumItems+1) * sizeof(int)*2 >= CSnapshot::MAX_SIZE ||
		m_NumItems+1 >= MAX_ITEMS)
	{
		// key and offset per item
		dbg_assert(m_DataSize + sizeof(CSnapshot) + m_NumItems * sizeof(int)*2 < CSnapshot::MAX_SIZE, "too much data");
		dbg_assert(m_NumItems < MAX_ITEMS, "too many items");
		return 0;
	}

	CSnapshotItem *pObj = (CSnapshotItem *)(m_aData + m_DataSize);

	mem_zero(pObj, sizeof(CSnapshotItem) + Size);
	pObj->SetKey(Type, ID);
	m_aOffsets[m_NumItems] = m_DataSize;
	m_DataSize += sizeof(CSnapshotItem) + Size;
	m_NumItems++;

	return pObj->Data();
}